

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase31::run(TestCase31 *this)

{
  StructDataBitCount *this_00;
  Builder builder_00;
  Builder builder_01;
  Reader reader;
  Reader reader_00;
  bool bVar1;
  undefined1 uVar2;
  Orphan<capnproto_test::capnp::test::TestAllTypes> *value;
  undefined8 in_stack_fffffffffffffd90;
  undefined6 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9e;
  undefined1 in_stack_fffffffffffffd9f;
  Reader local_250;
  Reader local_220;
  bool local_1eb;
  bool local_1ea;
  bool local_1e9;
  undefined1 auStack_1e8 [5];
  bool _kj_shouldLog_4;
  bool _kj_shouldLog_3;
  bool _kj_shouldLog_2;
  CapTableBuilder *pCStack_1e0;
  void *local_1d8;
  WirePointer *pWStack_1d0;
  undefined8 local_1c8;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_1c0;
  bool local_189;
  undefined1 local_188 [7];
  bool _kj_shouldLog_1;
  Orphan<capnproto_test::capnp::test::TestAllTypes> orphan;
  undefined1 auStack_160 [7];
  bool _kj_shouldLog;
  CapTableBuilder *pCStack_158;
  void *local_150;
  WirePointer *pWStack_148;
  undefined8 local_140;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase31 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField
            ((Builder *)auStack_160,(Builder *)local_128);
  builder_00._builder.capTable = (CapTableBuilder *)local_150;
  builder_00._builder.segment = (SegmentBuilder *)pCStack_158;
  builder_00._builder.data = pWStack_148;
  builder_00._builder.pointers = (WirePointer *)local_140;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffd90;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffd90 >> 0x30);
  initTestMessage(builder_00);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField((Builder *)local_128);
  if (!bVar1) {
    orphan.builder.location._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)orphan.builder.location._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x24,ERROR,"\"failed: expected \" \"root.hasStructField()\"",
                 (char (*) [39])"failed: expected root.hasStructField()");
      orphan.builder.location._7_1_ = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::disownStructField
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_188,(Builder *)local_128);
  bVar1 = Orphan<capnproto_test::capnp::test::TestAllTypes>::operator==
                    ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_188,(void *)0x0);
  if (bVar1) {
    local_189 = kj::_::Debug::shouldLog(ERROR);
    while (local_189 != false) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x27,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\"",
                 (char (*) [38])"failed: expected !(orphan == nullptr)");
      local_189 = false;
    }
  }
  Orphan<capnproto_test::capnp::test::TestAllTypes>::getReader
            (&local_1c0,(Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_188);
  reader._reader.capTable = (CapTableReader *)local_1c0._reader.data;
  reader._reader.segment = (SegmentReader *)local_1c0._reader.capTable;
  reader._reader.data = local_1c0._reader.pointers;
  reader._reader.pointers = (WirePointer *)local_1c0._reader._32_8_;
  reader._reader.dataSize = local_1c0._reader.nestingLimit;
  reader._reader.pointerCount = local_1c0._reader._44_2_;
  reader._reader._38_2_ = local_1c0._reader._46_2_;
  reader._reader._40_6_ = in_stack_fffffffffffffd98;
  reader._reader._46_1_ = in_stack_fffffffffffffd9e;
  reader._reader._47_1_ = in_stack_fffffffffffffd9f;
  checkTestMessage(reader);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::get
            ((BuilderFor<capnproto_test::capnp::test::TestAllTypes> *)auStack_1e8,
             (Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_188);
  builder_01._builder.capTable = (CapTableBuilder *)local_1d8;
  builder_01._builder.segment = (SegmentBuilder *)pCStack_1e0;
  builder_01._builder.data = pWStack_1d0;
  builder_01._builder.pointers = (WirePointer *)local_1c8;
  builder_01._builder.dataSize = local_1c0._reader.nestingLimit;
  builder_01._builder.pointerCount = local_1c0._reader._44_2_;
  builder_01._builder._38_2_ = local_1c0._reader._46_2_;
  checkTestMessage(builder_01);
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField((Builder *)local_128);
  if (bVar1) {
    local_1e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1e9 != false) {
      kj::_::Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x2b,ERROR,"\"failed: expected \" \"!(root.hasStructField())\"",
                 (char (*) [42])"failed: expected !(root.hasStructField())");
      local_1e9 = false;
    }
  }
  value = kj::mv<capnp::Orphan<capnproto_test::capnp::test::TestAllTypes>>
                    ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_188);
  capnproto_test::capnp::test::TestAllTypes::Builder::adoptStructField((Builder *)local_128,value);
  bVar1 = Orphan<capnproto_test::capnp::test::TestAllTypes>::operator==
                    ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_188,(void *)0x0);
  if (!bVar1) {
    local_1ea = kj::_::Debug::shouldLog(ERROR);
    while (local_1ea != false) {
      kj::_::Debug::log<char_const(&)[35]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x2e,ERROR,"\"failed: expected \" \"orphan == nullptr\"",
                 (char (*) [35])"failed: expected orphan == nullptr");
      local_1ea = false;
    }
  }
  uVar2 = capnproto_test::capnp::test::TestAllTypes::Builder::hasStructField((Builder *)local_128);
  if (!(bool)uVar2) {
    in_stack_fffffffffffffd9e = kj::_::Debug::shouldLog(ERROR);
    local_1eb = (bool)in_stack_fffffffffffffd9e;
    while (local_1eb != false) {
      kj::_::Debug::log<char_const(&)[39]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x2f,ERROR,"\"failed: expected \" \"root.hasStructField()\"",
                 (char (*) [39])"failed: expected root.hasStructField()");
      local_1eb = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader(&local_250,(Builder *)local_128);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField(&local_220,&local_250);
  reader_00._reader.capTable = (CapTableReader *)local_220._reader.data;
  reader_00._reader.segment = (SegmentReader *)local_220._reader.capTable;
  reader_00._reader.data = local_220._reader.pointers;
  reader_00._reader.pointers = (WirePointer *)local_220._reader._32_8_;
  reader_00._reader.dataSize = local_220._reader.nestingLimit;
  reader_00._reader.pointerCount = local_220._reader._44_2_;
  reader_00._reader._38_2_ = local_220._reader._46_2_;
  reader_00._reader._40_6_ = in_stack_fffffffffffffd98;
  reader_00._reader._46_1_ = in_stack_fffffffffffffd9e;
  reader_00._reader._47_1_ = uVar2;
  checkTestMessage(reader_00);
  Orphan<capnproto_test::capnp::test::TestAllTypes>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestAllTypes> *)local_188);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Any, AnyPointer) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();

  initTestMessage(root.getAnyPointerField().initAs<TestAllTypes>());
  checkTestMessage(root.getAnyPointerField().getAs<TestAllTypes>());
  checkTestMessage(root.asReader().getAnyPointerField().getAs<TestAllTypes>());

  root.getAnyPointerField().setAs<Text>("foo");
  EXPECT_EQ("foo", root.getAnyPointerField().getAs<Text>());
  EXPECT_EQ("foo", root.asReader().getAnyPointerField().getAs<Text>());

  root.getAnyPointerField().setAs<Data>(data("foo"));
  EXPECT_EQ(data("foo"), root.getAnyPointerField().getAs<Data>());
  EXPECT_EQ(data("foo"), root.asReader().getAnyPointerField().getAs<Data>());

  {
    root.getAnyPointerField().setAs<List<uint32_t>>({123, 456, 789});

    {
      List<uint32_t>::Builder list = root.getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(3u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
    }

    {
      List<uint32_t>::Reader list = root.asReader().getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(3u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
    }
  }

  {
    root.getAnyPointerField().setAs<List<Text>>({"foo", "bar"});

    {
      List<Text>::Builder list = root.getAnyPointerField().getAs<List<Text>>();
      ASSERT_EQ(2u, list.size());
      EXPECT_EQ("foo", list[0]);
      EXPECT_EQ("bar", list[1]);
    }

    {
      List<Text>::Reader list = root.asReader().getAnyPointerField().getAs<List<Text>>();
      ASSERT_EQ(2u, list.size());
      EXPECT_EQ("foo", list[0]);
      EXPECT_EQ("bar", list[1]);
    }
  }

  {
    {
      List<TestAllTypes>::Builder list = root.getAnyPointerField().initAs<List<TestAllTypes>>(2);
      ASSERT_EQ(2u, list.size());
      initTestMessage(list[0]);
    }

    {
      List<TestAllTypes>::Builder list = root.getAnyPointerField().getAs<List<TestAllTypes>>();
      ASSERT_EQ(2u, list.size());
      checkTestMessage(list[0]);
      checkTestMessageAllZero(list[1]);
    }

    {
      List<TestAllTypes>::Reader list =
          root.asReader().getAnyPointerField().getAs<List<TestAllTypes>>();
      ASSERT_EQ(2u, list.size());
      checkTestMessage(list[0]);
      checkTestMessageAllZero(list[1]);
    }
  }
}